

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameTableExprCb(Walker *pWalker,Expr *pExpr)

{
  RenameCtx *p;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  if (((pExpr->op == 0xa7) && ((pExpr->flags & 0x3000000) == 0)) &&
     (((pWalker->u).pRename)->pTab == (pExpr->y).pTab)) {
    renameTokenFind(pWalker->pParse,(pWalker->u).pRename,&pExpr->y);
  }
  return 0;
}

Assistant:

static int renameTableExprCb(Walker *pWalker, Expr *pExpr){
  RenameCtx *p = pWalker->u.pRename;
  if( pExpr->op==TK_COLUMN
   && ALWAYS(ExprUseYTab(pExpr))
   && p->pTab==pExpr->y.pTab
  ){
    renameTokenFind(pWalker->pParse, p, (void*)&pExpr->y.pTab);
  }
  return WRC_Continue;
}